

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O2

Parsekey __thiscall
free_format_parser::HMpsFF::parseRows(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  bool bVar1;
  bool bVar2;
  Parsekey PVar3;
  uint uVar4;
  size_t sVar5;
  iterator iVar6;
  string *psVar7;
  HMpsFF *this_00;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>,_bool>
  pVar8;
  bool skip;
  undefined4 local_108;
  undefined4 local_104;
  string rowname;
  size_t start;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  vector<double,_std::allocator<double>_> *local_b8;
  string name;
  size_t end;
  string strline;
  string word;
  
  strline._M_dataplus._M_p = (pointer)&strline.field_2;
  strline._M_string_length = 0;
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  strline.field_2._M_local_buf[0] = '\0';
  word.field_2._M_local_buf[0] = '\0';
  psVar7 = &this->objective_name;
  this_00 = (HMpsFF *)psVar7;
  std::__cxx11::string::assign((char *)psVar7);
  local_b8 = &this->row_lower;
  local_c8._8_8_ = &this->row_upper;
  local_c8._M_allocated_capacity = (size_type)&this->row_type;
  local_d0 = &(this->rowname2idx)._M_h;
  bVar1 = false;
  do {
    do {
      bVar2 = getMpsLine(this_00,file,&strline,&skip);
      if (!bVar2) {
        highsLogUser(log_options,kError,"Anomalous exit when parsing BOUNDS section of MPS file\n");
        this->num_row =
             (HighsInt)
             ((ulong)((long)(this->row_lower).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->row_lower).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3);
LAB_0022307b:
        PVar3 = kFail;
LAB_0022307e:
        std::__cxx11::string::~string((string *)&word);
        std::__cxx11::string::~string((string *)&strline);
        return PVar3;
      }
    } while (skip != false);
    bVar2 = timeout(this);
    if (bVar2) {
      PVar3 = kTimeout;
      goto LAB_0022307e;
    }
    start = 0;
    end = 0;
    PVar3 = checkFirstWord(this,&strline,&start,&end,&word);
    sVar5 = start;
    if (PVar3 != kNone) {
      highsLogDev(log_options,kInfo,"readMPS: Read ROWS    OK\n");
      if (!bVar1) {
        this->warning_issued_ = true;
        highsLogUser(log_options,kWarning,"No objective row found\n");
        rowname._M_dataplus._M_p._0_4_ = 0xffffffff;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<char_const(&)[27],int>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_d0,"artificial_empty_objective");
      }
      goto LAB_0022307e;
    }
    uVar4 = (byte)strline._M_dataplus._M_p[start] - 0x45;
    if (9 < uVar4) {
switchD_00222e0f_caseD_46:
      std::__cxx11::string::substr((ulong)&rowname,(ulong)&strline);
      trim(&rowname,&default_non_chars_abi_cxx11_);
      highsLogUser(log_options,kError,"Entry \"%s\" in ROWS section of MPS file is unidentified\n",
                   rowname._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&rowname);
      goto LAB_0022307b;
    }
    switch((uint)(byte)strline._M_dataplus._M_p[start]) {
    case 0x45:
      rowname._M_dataplus._M_p = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (local_b8,(double *)&rowname);
      rowname._M_dataplus._M_p = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)local_c8._8_8_,(double *)&rowname);
      rowname._M_dataplus._M_p._0_4_ = 1;
      std::
      vector<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
      ::emplace_back<free_format_parser::HMpsFF::Boundtype>
                ((vector<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
                  *)local_c8._M_allocated_capacity,(Boundtype *)&rowname);
      break;
    default:
      goto switchD_00222e0f_caseD_46;
    case 0x47:
      rowname._M_dataplus._M_p = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (local_b8,(double *)&rowname);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)local_c8._8_8_,
                 (value_type_conflict1 *)&kHighsInf);
      rowname._M_dataplus._M_p._0_4_ = 2;
      std::
      vector<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
      ::emplace_back<free_format_parser::HMpsFF::Boundtype>
                ((vector<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
                  *)local_c8._M_allocated_capacity,(Boundtype *)&rowname);
      break;
    case 0x4c:
      rowname._M_dataplus._M_p = &DAT_fff0000000000000;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (local_b8,(double *)&rowname);
      rowname._M_dataplus._M_p = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)local_c8._8_8_,(double *)&rowname);
      rowname._M_dataplus._M_p = rowname._M_dataplus._M_p & 0xffffffff00000000;
      std::
      vector<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
      ::emplace_back<free_format_parser::HMpsFF::Boundtype>
                ((vector<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
                  *)local_c8._M_allocated_capacity,(Boundtype *)&rowname);
      break;
    case 0x4e:
      if (bVar1) {
        local_104 = (undefined4)
                    CONCAT71((int7)((ulong)((long)&switchD_00222e0f::switchdataD_0039a5f0 +
                                           (long)(int)(&switchD_00222e0f::switchdataD_0039a5f0)
                                                      [uVar4]) >> 8),1);
        goto LAB_00222ef8;
      }
      this->cost_row_location = this->num_row;
      local_108 = (undefined4)CONCAT71((uint7)(uint3)((uint)this->num_row >> 8),1);
      local_104 = 0;
      bVar1 = true;
      goto LAB_00222f00;
    }
    local_104 = 0;
LAB_00222ef8:
    local_108 = 0;
LAB_00222f00:
    first_word(&rowname,&strline,sVar5 + 1);
    sVar5 = first_word_end(&strline,sVar5 + 1);
    bVar2 = is_end(&strline,sVar5,&default_non_chars_abi_cxx11_);
    if (!bVar2) {
      std::__cxx11::string::substr((ulong)&name,(ulong)&strline);
      trim(&name,&default_non_chars_abi_cxx11_);
      std::__cxx11::string::_M_assign((string *)&name);
      PVar3 = (uint)(name._M_string_length < 9) * 2 + kFail;
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&rowname);
      goto LAB_0022307e;
    }
    if ((char)local_104 == '\0') {
      name._M_dataplus._M_p._0_4_ = -1;
      if ((char)local_108 == '\0') {
        name._M_dataplus._M_p._0_4_ = this->num_row;
        this->num_row = (int)name._M_dataplus._M_p + 1;
      }
      pVar8 = std::
              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_M_emplace<std::__cxx11::string&,int>
                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)local_d0,&rowname,&name);
      if ((char)local_108 == '\0') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->row_names,&rowname);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar7);
      }
      if ((((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (this->has_duplicate_row_name_ == false)) {
        this->has_duplicate_row_name_ = true;
        iVar6 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(local_d0,&rowname);
        std::__cxx11::string::_M_assign((string *)&this->duplicate_row_name_);
        this->duplicate_row_name_index0_ =
             *(HighsInt *)
              ((long)iVar6.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                     ._M_cur + 0x28);
        this->duplicate_row_name_index1_ = this->num_row + -1;
      }
    }
    else {
      name._M_dataplus._M_p._0_4_ = -2;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string&,int>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_d0,&rowname,&name);
    }
    this_00 = (HMpsFF *)&rowname;
    std::__cxx11::string::~string((string *)this_00);
  } while( true );
}

Assistant:

HMpsFF::Parsekey HMpsFF::parseRows(const HighsLogOptions& log_options,
                                   std::istream& file) {
  std::string strline, word;
  bool hasobj = false;
  // Assign a default objective name
  objective_name = "Objective";

  assert(num_row == 0);
  assert(row_lower.size() == 0);
  assert(row_upper.size() == 0);
  bool skip;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    bool isobj = false;
    bool isFreeRow = false;

    size_t start = 0;
    size_t end = 0;

    HMpsFF::Parsekey key = checkFirstWord(strline, start, end, word);

    // start of new section?
    if (key != HMpsFF::Parsekey::kNone) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read ROWS    OK\n");
      if (!hasobj) {
        warning_issued_ = true;
        highsLogUser(log_options, HighsLogType::kWarning,
                     "No objective row found\n");
        rowname2idx.emplace("artificial_empty_objective", -1);
      };
      return key;
    }

    if (strline[start] == 'G') {
      row_lower.push_back(0.0);
      row_upper.push_back(kHighsInf);
      row_type.push_back(Boundtype::kGe);
    } else if (strline[start] == 'E') {
      row_lower.push_back(0.0);
      row_upper.push_back(0.0);
      row_type.push_back(Boundtype::kEq);
    } else if (strline[start] == 'L') {
      row_lower.push_back(-kHighsInf);
      row_upper.push_back(0.0);
      row_type.push_back(Boundtype::kLe);
    } else if (strline[start] == 'N') {
      if (!hasobj) {
        isobj = true;
        hasobj = true;
        cost_row_location = num_row;
      } else {
        isFreeRow = true;
      }
    } else {
      std::string unidentified = strline.substr(start);
      trim(unidentified);
      highsLogUser(log_options, HighsLogType::kError,
                   "Entry \"%s\" in ROWS section of MPS file is unidentified\n",
                   unidentified.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    std::string rowname = first_word(strline, start + 1);
    size_t rowname_end = first_word_end(strline, start + 1);

    // Detect if file is in fixed format.
    if (!is_end(strline, rowname_end)) {
      std::string name = strline.substr(start + 1);
      name = trim(name);
      if (name.size() > 8)
        return HMpsFF::Parsekey::kFail;
      else
        return HMpsFF::Parsekey::kFixedFormat;
    }

    // Do not add to matrix if row is free.
    if (isFreeRow) {
      rowname2idx.emplace(rowname, -2);
      continue;
    }

    // so in rowname2idx -1 is the objective, -2 is all the free rows
    auto ret = rowname2idx.emplace(rowname, isobj ? (-1) : (num_row++));
    // ret is a pair consisting of an iterator to the inserted
    // element (or the already-existing element if no insertion
    // happened) and a bool denoting whether the insertion took place

    // Else is enough here because all free rows are ignored.
    if (!isobj)
      row_names.push_back(rowname);
    else
      objective_name = rowname;

    if (!ret.second) {
      // Duplicate row name
      if (!has_duplicate_row_name_) {
        // This is the first so record it
        has_duplicate_row_name_ = true;
        auto mit = rowname2idx.find(rowname);
        assert(mit != rowname2idx.end());
        duplicate_row_name_ = rowname;
        duplicate_row_name_index0_ = mit->second;
        duplicate_row_name_index1_ = num_row - 1;
      }
    }
  }

  // Hard to imagine how the following lines are executed
  highsLogUser(log_options, HighsLogType::kError,
               "Anomalous exit when parsing BOUNDS section of MPS file\n");
  assert(1 == 0);
  // Update num_row in case there is free rows. They won't be added to the
  // constraint matrix.
  num_row = row_lower.size();
  return HMpsFF::Parsekey::kFail;
}